

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_tools.cpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* split(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *__return_storage_ptr__,string *str)

{
  bool bVar1;
  _Ios_Openmode _Var2;
  istream *piVar3;
  stringstream local_1c0 [8];
  stringstream ss;
  string local_38 [8];
  string buf;
  string *str_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *tokens;
  
  std::__cxx11::string::string(local_38);
  _Var2 = std::operator|(_S_out,_S_in);
  std::__cxx11::stringstream::stringstream(local_1c0,(string *)str,_Var2);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__);
  while( true ) {
    piVar3 = std::operator>>((istream *)local_1c0,local_38);
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
    if (!bVar1) break;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(__return_storage_ptr__,(value_type *)local_38);
  }
  std::__cxx11::stringstream::~stringstream(local_1c0);
  std::__cxx11::string::~string(local_38);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> split(const std::string& str) {
  std::string buf; // Have a buffer string
  std::stringstream ss(str); // Insert the string into a stream
  std::vector<std::string> tokens; // Create vector to hold our words

  while (ss >> buf)
    tokens.push_back(buf);

  return tokens;
}